

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::FeaturesTest_BadServiceName_Test::TestBody
          (FeaturesTest_BadServiceName_Test *this)

{
  string_view expected_errors;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  string_view local_30;
  string_view local_20;
  FeaturesTest_BadServiceName_Test *local_10;
  FeaturesTest_BadServiceName_Test *this_local;
  
  local_10 = this;
  ValidationErrorTest::BuildDescriptorMessagesInTestPool((ValidationErrorTest *)this);
  DescriptorPool::EnforceNamingStyle(&(this->super_FeaturesTest).super_FeaturesBaseTest.pool_,true);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_20,"naming1.proto");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_30,
             "\n    edition = \"2024\";\n    package naming1;\n    message M {}\n    service badService { rpc GoodMethodName(M) returns (M) {} }\n  "
            );
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_40,"Service name badService should begin with a capital letter");
  expected_errors._M_str = local_40._M_str;
  expected_errors._M_len = local_40._M_len;
  ValidationErrorTest::ParseAndBuildFileWithErrorSubstr
            ((ValidationErrorTest *)this,local_20,local_30,expected_errors);
  return;
}

Assistant:

TEST_F(FeaturesTest, BadServiceName) {
  BuildDescriptorMessagesInTestPool();

  pool_.EnforceNamingStyle(true);

  ParseAndBuildFileWithErrorSubstr(
      "naming1.proto", R"schema(
    edition = "2024";
    package naming1;
    message M {}
    service badService { rpc GoodMethodName(M) returns (M) {} }
  )schema",
      "Service name badService should begin with a capital letter");
}